

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<Catch::AssertionResult> * __thiscall
Catch::Option<Catch::AssertionResult>::operator=
          (Option<Catch::AssertionResult> *this,AssertionResult *_value)

{
  Option<Catch::AssertionResult> *in_RDI;
  AssertionResult *in_stack_ffffffffffffffd8;
  Option<Catch::AssertionResult> *in_stack_ffffffffffffffe0;
  AssertionResult *this_00;
  
  reset(in_stack_ffffffffffffffe0);
  this_00 = (AssertionResult *)in_RDI->storage;
  AssertionResult::AssertionResult(this_00,in_stack_ffffffffffffffd8);
  in_RDI->nullableValue = this_00;
  return in_RDI;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }